

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

char * readMacroArg(char name)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  LexerState *pLVar4;
  bool bVar5;
  int iVar6;
  uint32_t i;
  char *pcVar7;
  Symbol *sym;
  ulong uVar8;
  undefined7 in_register_00000039;
  char local_138 [264];
  
  pLVar4 = lexerState;
  iVar6 = (int)CONCAT71(in_register_00000039,name);
  uVar8 = CONCAT71(in_register_00000039,name) & 0xffffffff;
  if (iVar6 == 0x23) {
    pcVar7 = macro_GetAllArgs();
LAB_0010dcc7:
    if (pcVar7 != (char *)0x0) {
      return pcVar7;
    }
    pcVar7 = "Macro argument \'\\%c\' not defined\n";
LAB_0010dcdf:
    error(pcVar7,uVar8);
  }
  else {
    if (iVar6 == 0x30) {
      pcVar7 = "Invalid macro argument \'\\0\'\n";
    }
    else {
      if (iVar6 != 0x3c) {
        if (iVar6 == 0x40) {
          pcVar7 = macro_GetUniqueIDStr();
        }
        else {
          if (8 < (byte)(name - 0x31U)) {
            __assert_fail("name > \'0\' && name <= \'9\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                          ,0x314,"readMacroArg");
          }
          pcVar7 = macro_GetArg(iVar6 - 0x30);
        }
        goto LAB_0010dcc7;
      }
      bVar1 = lexerState->disableMacroArgs;
      bVar2 = lexerState->disableInterpolation;
      i = 0;
      lexerState->disableMacroArgs = false;
      pLVar4->disableInterpolation = false;
      iVar6 = peek();
      if (iVar6 - 0x30U < 10) {
        bVar5 = false;
        i = readNumber(10,0);
LAB_0010dd27:
        bVar3 = false;
      }
      else {
        bVar5 = startsIdentifier(iVar6);
        if (!bVar5) {
          bVar5 = true;
          goto LAB_0010dd27;
        }
        uVar8 = 0;
        while (bVar5 = continuesIdentifier(iVar6), bVar5) {
          if (uVar8 < 0x100) {
            local_138[uVar8] = (char)iVar6;
            uVar8 = uVar8 + 1;
          }
          shiftChar();
          iVar6 = peek();
        }
        if (uVar8 == 0x100) {
          warning(WARNING_LONG_STR,"Bracketed symbol name too long\n");
          uVar8 = 0xff;
        }
        local_138[uVar8] = '\0';
        sym = sym_FindScopedValidSymbol(local_138);
        if (sym == (Symbol *)0x0) {
          pcVar7 = "Bracketed symbol \"%s\" does not exist\n";
LAB_0010dd84:
          i = 0;
          error(pcVar7,local_138);
          bVar3 = true;
        }
        else {
          if (SYM_VAR < sym->type) {
            pcVar7 = "Bracketed symbol \"%s\" is not numeric\n";
            goto LAB_0010dd84;
          }
          i = sym_GetConstantSymValue(sym);
          bVar3 = false;
        }
        bVar5 = false;
      }
      iVar6 = peek();
      shiftChar();
      pLVar4 = lexerState;
      if (iVar6 != 0x3e) {
        pcVar7 = printChar(iVar6);
        error("Invalid character in bracketed macro argument %s\n",pcVar7);
        return (char *)0x0;
      }
      if (bVar5) {
        pcVar7 = "Empty bracketed macro argument\n";
      }
      else {
        if (i != 0 || bVar3) {
          lexerState->disableMacroArgs = bVar1;
          pLVar4->disableInterpolation = bVar2;
          if (i == 0) {
            return (char *)0x0;
          }
          pcVar7 = macro_GetArg(i);
          if (pcVar7 != (char *)0x0) {
            return pcVar7;
          }
          pcVar7 = "Macro argument \'\\<%u>\' not defined\n";
          uVar8 = (ulong)i;
          goto LAB_0010dcdf;
        }
        pcVar7 = "Invalid bracketed macro argument \'\\<0>\'\n";
      }
    }
    error(pcVar7);
  }
  return (char *)0x0;
}

Assistant:

static char const *readMacroArg(char name)
{
	char const *str = NULL;

	if (name == '@') {
		str = macro_GetUniqueIDStr();
	} else if (name == '#') {
		str = macro_GetAllArgs();
	} else if (name == '<') {
		uint32_t num = readBracketedMacroArgNum();

		if (num == 0)
			return NULL;
		str = macro_GetArg(num);
		if (!str)
			error("Macro argument '\\<%" PRIu32 ">' not defined\n", num);
		return str;
	} else if (name == '0') {
		error("Invalid macro argument '\\0'\n");
		return NULL;
	} else {
		assert(name > '0' && name <= '9');
		str = macro_GetArg(name - '0');
	}

	if (!str)
		error("Macro argument '\\%c' not defined\n", name);
	return str;
}